

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

void CheckCaption(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  int iVar2;
  AttVal *pAVar3;
  uint vers;
  
  pAVar3 = node->attributes;
  while (pAVar3 != (AttVal *)0x0) {
    pAVar1 = pAVar3->next;
    prvTidyCheckAttribute(doc,node,pAVar3);
    pAVar3 = pAVar1;
  }
  pAVar3 = prvTidyAttrGetById(node,TidyAttr_ALIGN);
  if ((pAVar3 != (AttVal *)0x0) && (pAVar3->value != (ctmbstr)0x0)) {
    iVar2 = prvTidytmbstrcasecmp(pAVar3->value,"left");
    if ((iVar2 == 0) ||
       ((pAVar3->value != (ctmbstr)0x0 &&
        (iVar2 = prvTidytmbstrcasecmp(pAVar3->value,"right"), iVar2 == 0)))) {
      vers = 0x248;
    }
    else {
      if (((pAVar3->value == (ctmbstr)0x0) ||
          (iVar2 = prvTidytmbstrcasecmp(pAVar3->value,"top"), iVar2 != 0)) &&
         ((pAVar3->value == (ctmbstr)0x0 ||
          (iVar2 = prvTidytmbstrcasecmp(pAVar3->value,"bottom"), iVar2 != 0)))) {
        prvTidyReportAttrError(doc,node,pAVar3,0x22b);
        return;
      }
      vers = 0xfffffffc;
    }
    prvTidyConstrainVersion(doc,vers);
    return;
  }
  return;
}

Assistant:

void CheckCaption(TidyDocImpl* doc, Node *node)
{
    AttVal *attval;

    TY_(CheckAttributes)(doc, node);

    attval = TY_(AttrGetById)(node, TidyAttr_ALIGN);

    if (!AttrHasValue(attval))
        return;

    if (AttrValueIs(attval, "left") || AttrValueIs(attval, "right"))
        TY_(ConstrainVersion)(doc, VERS_HTML40_LOOSE);
    else if (AttrValueIs(attval, "top") || AttrValueIs(attval, "bottom"))
        TY_(ConstrainVersion)(doc, ~(VERS_HTML20|VERS_HTML32));
    else
        TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
}